

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O0

char * __thiscall llbuild::core::BuildEngineTrace::getTaskName(BuildEngineTrace *this,Task *task)

{
  bool bVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar2;
  _Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_88;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  result;
  char name [64];
  _Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_30;
  iterator it;
  FILE *fp;
  Task *task_local;
  BuildEngineTrace *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             )this->outputPtr;
  fp = (FILE *)task;
  task_local = (Task *)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llbuild::core::Task_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_llbuild::core::Task_*>,_std::equal_to<const_llbuild::core::Task_*>,_std::allocator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->taskNames,(key_type *)&fp);
  name._56_8_ = std::
                unordered_map<const_llbuild::core::Task_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_llbuild::core::Task_*>,_std::equal_to<const_llbuild::core::Task_*>,_std::allocator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(&this->taskNames);
  bVar1 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      *)(name + 0x38));
  if (bVar1) {
    std::__detail::
    _Node_iterator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  *)&local_30);
    this_local = (BuildEngineTrace *)std::__cxx11::string::c_str();
  }
  else {
    this->numNamedTasks = this->numNamedTasks + 1;
    snprintf(&result.second,0x40,"T%d");
    pVar2 = std::
            unordered_map<llbuild::core::Task_const*,std::__cxx11::string,std::hash<llbuild::core::Task_const*>,std::equal_to<llbuild::core::Task_const*>,std::allocator<std::pair<llbuild::core::Task_const*const,std::__cxx11::string>>>
            ::emplace<llbuild::core::Task_const*&,char(&)[64]>
                      ((unordered_map<llbuild::core::Task_const*,std::__cxx11::string,std::hash<llbuild::core::Task_const*>,std::equal_to<llbuild::core::Task_const*>,std::allocator<std::pair<llbuild::core::Task_const*const,std::__cxx11::string>>>
                        *)&this->taskNames,(Task **)&fp,(char (*) [64])&result.second);
    local_88._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
         ._M_cur;
    result.first.
    super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_cur._0_1_ = pVar2.second;
    fprintf((FILE *)it.
                    super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    ._M_cur,"{ \"new-task\", \"%s\" },\n",&result.second);
    std::__detail::
    _Node_iterator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  *)&local_88);
    this_local = (BuildEngineTrace *)std::__cxx11::string::c_str();
  }
  return (char *)this_local;
}

Assistant:

const char* BuildEngineTrace::getTaskName(const Task* task) {
  FILE *fp = static_cast<FILE*>(outputPtr);

  // See if we have already assigned a name.
  auto it = taskNames.find(task);
  if (it != taskNames.end())
    return it->second.c_str();

  // Otherwise, create a name.
  char name[64];
  snprintf(name, sizeof(name), "T%d", ++numNamedTasks);
  auto result = taskNames.emplace(task, name);

  // Report the newly seen rule.
  fprintf(fp, "{ \"new-task\", \"%s\" },\n", name);

  return result.first->second.c_str();
}